

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O2

void __thiscall Alice::PermuteData(Alice *this)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  Server *this_00;
  ostream *poVar4;
  long lVar5;
  int i;
  long lVar6;
  int j;
  long lVar7;
  _Vector_base<DataElement,_std::allocator<DataElement>_> local_c8;
  undefined1 local_b0 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  Pi_R_D;
  undefined1 local_80 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  S;
  vector<DataElement,_std::allocator<DataElement>_> Temp;
  undefined1 local_48 [8];
  vector<DataElement,_std::allocator<DataElement>_> V;
  
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)local_b0,(long)(this->super_Party).n_d,(allocator_type *)local_80);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)local_80,(long)(this->super_Party).n_d,(allocator_type *)local_48);
  std::vector<DataElement,_std::allocator<DataElement>_>::vector
            ((vector<DataElement,_std::allocator<DataElement>_> *)local_48,
             (long)(this->super_Party).n_d,
             (allocator_type *)
             &S.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<DataElement,_std::allocator<DataElement>_>::vector
            ((vector<DataElement,_std::allocator<DataElement>_> *)
             &S.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(this->super_Party).n_d,
             (allocator_type *)
             &Pi_R_D.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Server::ReceiveDataVector
            ((vector<DataElement,_std::allocator<DataElement>_> *)
             &Pi_R_D.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,this->srv);
  std::vector<DataElement,_std::allocator<DataElement>_>::operator=
            ((vector<DataElement,_std::allocator<DataElement>_> *)local_48,
             (vector<DataElement,_std::allocator<DataElement>_> *)
             &Pi_R_D.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<DataElement,_std::allocator<DataElement>_>::~_Vector_base
            ((_Vector_base<DataElement,_std::allocator<DataElement>_> *)
             &Pi_R_D.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<DataElement,std::allocator<DataElement>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<DataElement*,std::vector<DataElement,std::allocator<DataElement>>>>
            ((vector<DataElement,std::allocator<DataElement>> *)
             &S.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_48,
             V.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  _M_assign_aux<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)local_80,
             (this->super_Party).D.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->super_Party).D.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::operator<<((ostream *)&std::cout,"Permutation Pi_A: ");
  lVar5 = 0;
  for (lVar6 = 0; lVar6 < (this->super_Party).n_d; lVar6 = lVar6 + 1) {
    poVar4 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        (this->super_Party).Pi_D.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar6]);
    std::operator<<(poVar4," ");
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 8) {
      iVar2 = (this->super_Party).Pi_D.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar6];
      *(undefined8 *)
       (*(long *)&(this->super_Party).D.
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar2].
                  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data +
       lVar7) = *(undefined8 *)
                 ((long)(((pointer)((long)local_80 + lVar6 * 0x18))->
                        super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar7);
      *(undefined8 *)((long)((pointer)((long)local_48 + (long)iVar2 * 0x10))->val + lVar7) =
           *(undefined8 *)
            ((long)&((S.
                      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                    super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
                    ._M_start + lVar7 + lVar5);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)((long)local_b0 + (long)iVar2 * 0x18),
                 (value_type *)
                 (*(long *)&(this->super_Party).R_D.
                            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar6].
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data + lVar7));
    }
    lVar5 = lVar5 + 0x10;
  }
  std::operator<<((ostream *)&std::cout,"\nAlice\'s Permuted Data D_A:\n ");
  lVar6 = 0;
  for (lVar5 = 0; lVar5 < (this->super_Party).n_d; lVar5 = lVar5 + 1) {
    for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
      lVar3 = *(long *)&(this->super_Party).D.
                        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar5].
                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data;
      *(long *)(lVar3 + lVar7 * 8) =
           *(long *)(lVar3 + lVar7 * 8) +
           *(long *)(*(long *)&(this->super_Party).U_D.
                               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar5].
                               super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data + lVar7 * 8);
      poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
      std::operator<<(poVar4," ");
      plVar1 = (long *)((long)(long *)local_48 + lVar7 * 8 + lVar6);
      *plVar1 = *plVar1 - ((((pointer)((long)local_b0 + lVar5 * 0x18))->
                           super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                           super__Vector_impl_data._M_start[lVar7] +
                          *(long *)(*(long *)&(this->super_Party).U_D.
                                              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[lVar5].
                                              super__Vector_base<long,_std::allocator<long>_>.
                                              _M_impl.super__Vector_impl_data + lVar7 * 8));
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    lVar6 = lVar6 + 0x10;
  }
  this_00 = this->srv;
  std::vector<DataElement,_std::allocator<DataElement>_>::vector
            ((vector<DataElement,_std::allocator<DataElement>_> *)&local_c8,
             (vector<DataElement,_std::allocator<DataElement>_> *)local_48);
  Server::SendDataVector
            (this_00,(vector<DataElement,_std::allocator<DataElement>_> *)&local_c8,
             (this->super_Party).n_p);
  std::_Vector_base<DataElement,_std::allocator<DataElement>_>::~_Vector_base(&local_c8);
  std::_Vector_base<DataElement,_std::allocator<DataElement>_>::~_Vector_base
            ((_Vector_base<DataElement,_std::allocator<DataElement>_> *)
             &S.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<DataElement,_std::allocator<DataElement>_>::~_Vector_base
            ((_Vector_base<DataElement,_std::allocator<DataElement>_> *)local_48);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)local_80);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)local_b0);
  return;
}

Assistant:

void Alice::PermuteData()
{
    std::vector<std::vector<long>> Pi_R_D(n_d), S(n_d);
    std::vector<DataElement> V(n_d), Temp(n_d);
    V = srv->ReceiveDataVector();    //receive Bob's masked share of D
    Temp.assign(V.begin(), V.end());
    S.assign(D.begin(), D.end());
    std::cout<<"Permutation Pi_A: ";
    for(int i=0; i < n_d; i++)
    {
        std::cout<<Pi_D[i]<<" ";
        for(int j=0;  j < 2; j++)
        {
            D[Pi_D[i]][j] = S[i][j]; //Applying Pi on Alice's Share of D
            V[Pi_D[i]].val[j] = Temp[i].val[j]; //Applying Pi on Bob's masked Share of D
            Pi_R_D[Pi_D[i]].push_back(R_D[i][j]);  //Prepping shuffle vector needed for resplit
        }
    }
    std::cout<<"\nAlice's Permuted Data D_A:\n ";
    for(int i=0; i < n_d; i++)
    {
        for(int j=0;  j < 2; j++)
        {
            D[i][j] += U_D[i][j];   //resplitting Alice's share of D
            std::cout<<D[i][j]<<" ";
            V[i].val[j] = V[i].val[j] - Pi_R_D[i][j] - U_D[i][j]; //resplitting Bob's share of D
        }
        std::cout<<std::endl;
    }
    srv->SendDataVector(V, n_p); //sending Bob his BlindPermuted share of D
}